

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O1

void FFT(NoiseSuppressionC *self,float *time_data,size_t time_data_length,size_t magnitude_length,
        float *real,float *imag,float *magn)

{
  long lVar1;
  float fVar2;
  
  if ((time_data_length >> 1) + 1 == magnitude_length) {
    WebRtc_rdft(time_data_length,1,time_data,self->ip,self->wfft);
    *imag = 0.0;
    fVar2 = *time_data;
    *real = fVar2;
    *magn = ABS(fVar2) + 1.0;
    imag[magnitude_length - 1] = 0.0;
    fVar2 = time_data[1];
    real[magnitude_length - 1] = fVar2;
    magn[magnitude_length - 1] = ABS(fVar2) + 1.0;
    if (1 < magnitude_length - 1) {
      lVar1 = 0;
      do {
        real[lVar1 + 1] = time_data[lVar1 * 2 + 2];
        fVar2 = time_data[lVar1 * 2 + 3];
        imag[lVar1 + 1] = fVar2;
        fVar2 = real[lVar1 + 1] * real[lVar1 + 1] + fVar2 * fVar2;
        if (fVar2 < 0.0) {
          fVar2 = sqrtf(fVar2);
        }
        else {
          fVar2 = SQRT(fVar2);
        }
        magn[lVar1 + 1] = fVar2 + 1.0;
        lVar1 = lVar1 + 1;
      } while (magnitude_length - 2 != lVar1);
    }
    return;
  }
  __assert_fail("magnitude_length == time_data_length / 2 + 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                ,0x380,
                "void FFT(NoiseSuppressionC *, float *, size_t, size_t, float *, float *, float *)")
  ;
}

Assistant:

static void FFT(NoiseSuppressionC* self,
                float* time_data,
                size_t time_data_length,
                size_t magnitude_length,
                float* real,
                float* imag,
                float* magn) {
  size_t i;

  assert(magnitude_length == time_data_length / 2 + 1);

  WebRtc_rdft(time_data_length, 1, time_data, self->ip, self->wfft);

  imag[0] = 0;
  real[0] = time_data[0];
  magn[0] = fabsf(real[0]) + 1.f;
  imag[magnitude_length - 1] = 0;
  real[magnitude_length - 1] = time_data[1];
  magn[magnitude_length - 1] = fabsf(real[magnitude_length - 1]) + 1.f;
  for (i = 1; i < magnitude_length - 1; ++i) {
    real[i] = time_data[2 * i];
    imag[i] = time_data[2 * i + 1];
    // Magnitude spectrum.
    magn[i] = sqrtf(real[i] * real[i] + imag[i] * imag[i]) + 1.f;
  }
}